

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O3

void __thiscall spdlog::details::backtracer::enable(backtracer *this,size_t size)

{
  int iVar1;
  allocator_type local_51;
  circular_q<spdlog::details::log_msg_buffer> local_50;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    (this->enabled_)._M_base._M_i = true;
    local_50.max_items_ = size + 1;
    local_50.head_ = 0;
    local_50.tail_ = 0;
    local_50.overrun_counter_ = 0;
    std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
    vector((vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
            *)&local_50.v_,local_50.max_items_,&local_51);
    circular_q<spdlog::details::log_msg_buffer>::copy_moveable(&this->messages_,&local_50);
    std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
    ~vector((vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
             *)&local_50.v_);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SPDLOG_INLINE void backtracer::enable(size_t size) {
    std::lock_guard<std::mutex> lock{mutex_};
    enabled_.store(true, std::memory_order_relaxed);
    messages_ = circular_q<log_msg_buffer>{size};
}